

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise1d.cpp
# Opt level: O3

int ncnn::convolutiondepthwise1d
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int stride_w,int dilation_w,int group,int activation_type,Mat *activation_params,
              Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  size_t sVar7;
  int iVar8;
  int iVar9;
  float *pfVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  float *pfVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  float *pfVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  int local_fc;
  ulong local_e8;
  long local_d8;
  float *local_d0;
  ulong local_c0;
  
  uVar3 = bottom_blob->h;
  uVar17 = (ulong)uVar3;
  iVar4 = top_blob->w;
  lVar13 = (long)iVar4;
  pvVar5 = bias_data->data;
  if (pvVar5 == (void *)0x0) {
    bVar23 = true;
  }
  else {
    bVar23 = (long)bias_data->c * bias_data->cstep == 0;
  }
  if (top_blob->h == group && uVar3 == group) {
    if (0 < group) {
      pvVar6 = top_blob->data;
      sVar7 = top_blob->elemsize;
      local_d0 = (float *)bottom_blob->data;
      uVar17 = (long)bottom_blob->w * bottom_blob->elemsize;
      uVar20 = 0;
      do {
        if (0 < iVar4) {
          lVar22 = 0;
          pfVar14 = local_d0;
          do {
            fVar26 = 0.0;
            if (!bVar23) {
              fVar26 = *(float *)((long)pvVar5 + uVar20 * 4);
            }
            if (0 < kernel_w) {
              uVar11 = 0;
              pfVar10 = pfVar14;
              do {
                fVar26 = fVar26 + *(float *)((long)&weight_data->data + uVar11 * 4) * *pfVar10;
                uVar11 = uVar11 + 1;
                pfVar10 = pfVar10 + dilation_w;
              } while ((uint)kernel_w != uVar11);
            }
            fVar24 = fVar26;
            switch(activation_type) {
            case 1:
              if (fVar26 <= 0.0) {
                fVar24 = 0.0;
              }
              break;
            case 2:
              fVar24 = (float)(~-(uint)(0.0 < fVar26) & *(uint *)&activation_params->data |
                              -(uint)(0.0 < fVar26) & 0x3f800000) * fVar26;
              break;
            case 3:
              if (fVar26 <= *(float *)&activation_params->data) {
                fVar26 = *(float *)&activation_params->data;
              }
              fVar1 = *(float *)((long)&activation_params->data + 4);
              fVar24 = fVar26;
              if (fVar1 <= fVar26) {
                fVar24 = fVar1;
              }
              break;
            case 4:
              fVar26 = expf(-fVar26);
              fVar24 = 1.0 / (fVar26 + 1.0);
              break;
            case 5:
              fVar24 = expf(fVar26);
              fVar24 = logf(fVar24 + 1.0);
              fVar24 = tanhf(fVar24);
              fVar24 = fVar24 * fVar26;
              break;
            case 6:
              fVar1 = *(float *)&activation_params->data;
              fVar2 = *(float *)((long)&activation_params->data + 4);
              fVar25 = -fVar2 / fVar1;
              fVar24 = 0.0;
              if ((fVar25 <= fVar26) && (fVar24 = fVar26, fVar26 <= fVar25 + 1.0 / fVar1)) {
                fVar24 = (fVar1 * fVar26 + fVar2) * fVar26;
              }
            }
            *(float *)((long)pvVar6 + lVar22 * 4 + sVar7 * lVar13 * uVar20) = fVar24;
            lVar22 = lVar22 + 1;
            pfVar14 = pfVar14 + stride_w;
          } while (lVar22 != lVar13);
        }
        uVar20 = uVar20 + 1;
        weight_data = (Mat *)((long)&weight_data->data + (long)kernel_w * 4);
        local_d0 = (float *)((long)local_d0 + uVar17);
      } while (uVar20 != (uint)group);
    }
  }
  else {
    uVar20 = (long)(int)uVar3 / (long)group;
    uVar17 = uVar20 & 0xffffffff;
    iVar8 = (int)uVar20;
    if (0 < group) {
      uVar11 = (long)top_blob->h / (long)group;
      pvVar6 = top_blob->data;
      sVar7 = top_blob->elemsize;
      iVar9 = (int)uVar11;
      uVar17 = 0;
      local_fc = 0;
      local_c0 = 0;
      do {
        if (0 < iVar9) {
          local_d8 = (long)&weight_data->data + (long)local_fc * 4;
          local_e8 = 0;
          do {
            if (0 < iVar4) {
              lVar22 = local_e8 + local_c0 * (long)iVar9;
              lVar21 = (long)bottom_blob->w * bottom_blob->elemsize;
              pfVar14 = (float *)(lVar21 * uVar17 + (long)bottom_blob->data);
              lVar16 = 0;
              do {
                fVar26 = 0.0;
                if (!bVar23) {
                  fVar26 = *(float *)((long)pvVar5 + lVar22 * 4);
                }
                if (0 < iVar8) {
                  uVar15 = 0;
                  pfVar10 = pfVar14;
                  lVar12 = local_d8;
                  do {
                    if (0 < kernel_w) {
                      uVar19 = 0;
                      pfVar18 = pfVar10;
                      do {
                        fVar26 = fVar26 + *(float *)(lVar12 + uVar19 * 4) * *pfVar18;
                        uVar19 = uVar19 + 1;
                        pfVar18 = pfVar18 + dilation_w;
                      } while ((uint)kernel_w != uVar19);
                    }
                    uVar15 = uVar15 + 1;
                    lVar12 = lVar12 + (long)kernel_w * 4;
                    pfVar10 = (float *)((long)pfVar10 + lVar21);
                  } while (uVar15 != (uVar20 & 0xffffffff));
                }
                fVar24 = fVar26;
                switch(activation_type) {
                case 1:
                  if (fVar26 <= 0.0) {
                    fVar24 = 0.0;
                  }
                  break;
                case 2:
                  fVar24 = (float)(~-(uint)(0.0 < fVar26) & *(uint *)&activation_params->data |
                                  -(uint)(0.0 < fVar26) & 0x3f800000) * fVar26;
                  break;
                case 3:
                  if (fVar26 <= *(float *)&activation_params->data) {
                    fVar26 = *(float *)&activation_params->data;
                  }
                  fVar1 = *(float *)((long)&activation_params->data + 4);
                  fVar24 = fVar26;
                  if (fVar1 <= fVar26) {
                    fVar24 = fVar1;
                  }
                  break;
                case 4:
                  fVar26 = expf(-fVar26);
                  fVar24 = 1.0 / (fVar26 + 1.0);
                  break;
                case 5:
                  fVar24 = expf(fVar26);
                  fVar24 = logf(fVar24 + 1.0);
                  fVar24 = tanhf(fVar24);
                  fVar24 = fVar24 * fVar26;
                  break;
                case 6:
                  fVar1 = *(float *)&activation_params->data;
                  fVar2 = *(float *)((long)&activation_params->data + 4);
                  fVar25 = -fVar2 / fVar1;
                  fVar24 = 0.0;
                  if ((fVar25 <= fVar26) && (fVar24 = fVar26, fVar26 <= fVar25 + 1.0 / fVar1)) {
                    fVar24 = (fVar1 * fVar26 + fVar2) * fVar26;
                  }
                }
                *(float *)((long)pvVar6 + lVar16 * 4 + sVar7 * lVar13 * lVar22) = fVar24;
                lVar16 = lVar16 + 1;
                pfVar14 = pfVar14 + stride_w;
              } while (lVar16 != lVar13);
            }
            local_e8 = local_e8 + 1;
            local_d8 = local_d8 + (long)(iVar8 * kernel_w) * 4;
          } while (local_e8 != (uVar11 & 0xffffffff));
        }
        local_c0 = local_c0 + 1;
        local_fc = local_fc + iVar9 * iVar8 * kernel_w;
        uVar17 = (ulong)(uint)((int)uVar17 + iVar8);
      } while (local_c0 != (uint)group);
    }
  }
  return (int)uVar17;
}

Assistant:

static int convolutiondepthwise1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    // depth-wise
    if (h == group && group == outh)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.row(g);
            const float* kptr = (const float*)weight_data + kernel_w * g;

            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[g];

                const float* sptr = bottom_blob.row(g) + j * stride_w;

                for (int k = 0; k < kernel_w; k++)
                {
                    float val = *sptr;
                    float w = kptr[k];
                    sum += val * w;

                    sptr += dilation_w;
                }

                outptr[j] = activation_ss(sum, activation_type, activation_params);
            }
        }
    }
    else
    {
        // group convolution
        const int h_g = h / group;
        const int outh_g = outh / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outh_g; p++)
            {
                float* outptr = top_blob.row(g * outh_g + p);
                const float* weight_data_ptr = (const float*)weight_data + kernel_w * h_g * outh_g * g;

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[outh_g * g + p];

                    const float* kptr = weight_data_ptr + kernel_w * h_g * p;

                    for (int q = 0; q < h_g; q++)
                    {
                        const float* sptr = bottom_blob.row(h_g * g + q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = *sptr;
                            float w = kptr[k];
                            sum += val * w;

                            sptr += dilation_w;
                        }

                        kptr += kernel_w;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }
            }
        }
    }

    return 0;
}